

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O3

ze_result_t
zesGetFrequencyProcAddrTable(ze_api_version_t version,zes_frequency_dditable_t *pDdiTable)

{
  zes_pfnFrequencyGetAvailableClocks_t p_Var1;
  zes_pfnFrequencySetRange_t p_Var2;
  zes_pfnFrequencyGetThrottleTime_t p_Var3;
  zes_pfnFrequencyOcGetFrequencyTarget_t p_Var4;
  zes_pfnFrequencyOcGetVoltageTarget_t p_Var5;
  zes_pfnFrequencyOcSetMode_t p_Var6;
  zes_pfnFrequencyOcGetIccMax_t p_Var7;
  zes_pfnFrequencyOcGetTjMax_t p_Var8;
  ze_api_version_t *pzVar9;
  ze_result_t zVar10;
  
  pzVar9 = validation_layer::context;
  if (pDdiTable == (zes_frequency_dditable_t *)0x0) {
    zVar10 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar10 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((*validation_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
      p_Var1 = pDdiTable->pfnGetAvailableClocks;
      *(zes_pfnFrequencyGetProperties_t *)(validation_layer::context + 0x2b8) =
           pDdiTable->pfnGetProperties;
      *(zes_pfnFrequencyGetAvailableClocks_t *)(pzVar9 + 0x2ba) = p_Var1;
      pDdiTable->pfnGetProperties = validation_layer::zesFrequencyGetProperties;
      pDdiTable->pfnGetAvailableClocks = validation_layer::zesFrequencyGetAvailableClocks;
      p_Var2 = pDdiTable->pfnSetRange;
      *(zes_pfnFrequencyGetRange_t *)(pzVar9 + 700) = pDdiTable->pfnGetRange;
      *(zes_pfnFrequencySetRange_t *)(pzVar9 + 0x2be) = p_Var2;
      pDdiTable->pfnGetRange = validation_layer::zesFrequencyGetRange;
      pDdiTable->pfnSetRange = validation_layer::zesFrequencySetRange;
      p_Var3 = pDdiTable->pfnGetThrottleTime;
      *(zes_pfnFrequencyGetState_t *)(pzVar9 + 0x2c0) = pDdiTable->pfnGetState;
      *(zes_pfnFrequencyGetThrottleTime_t *)(pzVar9 + 0x2c2) = p_Var3;
      pDdiTable->pfnGetState = validation_layer::zesFrequencyGetState;
      pDdiTable->pfnGetThrottleTime = validation_layer::zesFrequencyGetThrottleTime;
      p_Var4 = pDdiTable->pfnOcGetFrequencyTarget;
      *(zes_pfnFrequencyOcGetCapabilities_t *)(pzVar9 + 0x2c4) = pDdiTable->pfnOcGetCapabilities;
      *(zes_pfnFrequencyOcGetFrequencyTarget_t *)(pzVar9 + 0x2c6) = p_Var4;
      pDdiTable->pfnOcGetCapabilities = validation_layer::zesFrequencyOcGetCapabilities;
      pDdiTable->pfnOcGetFrequencyTarget = validation_layer::zesFrequencyOcGetFrequencyTarget;
      p_Var5 = pDdiTable->pfnOcGetVoltageTarget;
      *(zes_pfnFrequencyOcSetFrequencyTarget_t *)(pzVar9 + 0x2c8) =
           pDdiTable->pfnOcSetFrequencyTarget;
      *(zes_pfnFrequencyOcGetVoltageTarget_t *)(pzVar9 + 0x2ca) = p_Var5;
      pDdiTable->pfnOcSetFrequencyTarget = validation_layer::zesFrequencyOcSetFrequencyTarget;
      pDdiTable->pfnOcGetVoltageTarget = validation_layer::zesFrequencyOcGetVoltageTarget;
      p_Var6 = pDdiTable->pfnOcSetMode;
      *(zes_pfnFrequencyOcSetVoltageTarget_t *)(pzVar9 + 0x2cc) = pDdiTable->pfnOcSetVoltageTarget;
      *(zes_pfnFrequencyOcSetMode_t *)(pzVar9 + 0x2ce) = p_Var6;
      pDdiTable->pfnOcSetVoltageTarget = validation_layer::zesFrequencyOcSetVoltageTarget;
      pDdiTable->pfnOcSetMode = validation_layer::zesFrequencyOcSetMode;
      p_Var7 = pDdiTable->pfnOcGetIccMax;
      *(zes_pfnFrequencyOcGetMode_t *)(pzVar9 + 0x2d0) = pDdiTable->pfnOcGetMode;
      *(zes_pfnFrequencyOcGetIccMax_t *)(pzVar9 + 0x2d2) = p_Var7;
      pDdiTable->pfnOcGetMode = validation_layer::zesFrequencyOcGetMode;
      pDdiTable->pfnOcGetIccMax = validation_layer::zesFrequencyOcGetIccMax;
      p_Var8 = pDdiTable->pfnOcGetTjMax;
      *(zes_pfnFrequencyOcSetIccMax_t *)(pzVar9 + 0x2d4) = pDdiTable->pfnOcSetIccMax;
      *(zes_pfnFrequencyOcGetTjMax_t *)(pzVar9 + 0x2d6) = p_Var8;
      pDdiTable->pfnOcSetIccMax = validation_layer::zesFrequencyOcSetIccMax;
      pDdiTable->pfnOcGetTjMax = validation_layer::zesFrequencyOcGetTjMax;
      *(zes_pfnFrequencyOcSetTjMax_t *)(pzVar9 + 0x2d8) = pDdiTable->pfnOcSetTjMax;
      pDdiTable->pfnOcSetTjMax = validation_layer::zesFrequencyOcSetTjMax;
      return ZE_RESULT_SUCCESS;
    }
  }
  return zVar10;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zesGetFrequencyProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zes_frequency_dditable_t* pDdiTable             ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zesDdiTable.Frequency;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnGetProperties                            = pDdiTable->pfnGetProperties;
    pDdiTable->pfnGetProperties                          = validation_layer::zesFrequencyGetProperties;

    dditable.pfnGetAvailableClocks                       = pDdiTable->pfnGetAvailableClocks;
    pDdiTable->pfnGetAvailableClocks                     = validation_layer::zesFrequencyGetAvailableClocks;

    dditable.pfnGetRange                                 = pDdiTable->pfnGetRange;
    pDdiTable->pfnGetRange                               = validation_layer::zesFrequencyGetRange;

    dditable.pfnSetRange                                 = pDdiTable->pfnSetRange;
    pDdiTable->pfnSetRange                               = validation_layer::zesFrequencySetRange;

    dditable.pfnGetState                                 = pDdiTable->pfnGetState;
    pDdiTable->pfnGetState                               = validation_layer::zesFrequencyGetState;

    dditable.pfnGetThrottleTime                          = pDdiTable->pfnGetThrottleTime;
    pDdiTable->pfnGetThrottleTime                        = validation_layer::zesFrequencyGetThrottleTime;

    dditable.pfnOcGetCapabilities                        = pDdiTable->pfnOcGetCapabilities;
    pDdiTable->pfnOcGetCapabilities                      = validation_layer::zesFrequencyOcGetCapabilities;

    dditable.pfnOcGetFrequencyTarget                     = pDdiTable->pfnOcGetFrequencyTarget;
    pDdiTable->pfnOcGetFrequencyTarget                   = validation_layer::zesFrequencyOcGetFrequencyTarget;

    dditable.pfnOcSetFrequencyTarget                     = pDdiTable->pfnOcSetFrequencyTarget;
    pDdiTable->pfnOcSetFrequencyTarget                   = validation_layer::zesFrequencyOcSetFrequencyTarget;

    dditable.pfnOcGetVoltageTarget                       = pDdiTable->pfnOcGetVoltageTarget;
    pDdiTable->pfnOcGetVoltageTarget                     = validation_layer::zesFrequencyOcGetVoltageTarget;

    dditable.pfnOcSetVoltageTarget                       = pDdiTable->pfnOcSetVoltageTarget;
    pDdiTable->pfnOcSetVoltageTarget                     = validation_layer::zesFrequencyOcSetVoltageTarget;

    dditable.pfnOcSetMode                                = pDdiTable->pfnOcSetMode;
    pDdiTable->pfnOcSetMode                              = validation_layer::zesFrequencyOcSetMode;

    dditable.pfnOcGetMode                                = pDdiTable->pfnOcGetMode;
    pDdiTable->pfnOcGetMode                              = validation_layer::zesFrequencyOcGetMode;

    dditable.pfnOcGetIccMax                              = pDdiTable->pfnOcGetIccMax;
    pDdiTable->pfnOcGetIccMax                            = validation_layer::zesFrequencyOcGetIccMax;

    dditable.pfnOcSetIccMax                              = pDdiTable->pfnOcSetIccMax;
    pDdiTable->pfnOcSetIccMax                            = validation_layer::zesFrequencyOcSetIccMax;

    dditable.pfnOcGetTjMax                               = pDdiTable->pfnOcGetTjMax;
    pDdiTable->pfnOcGetTjMax                             = validation_layer::zesFrequencyOcGetTjMax;

    dditable.pfnOcSetTjMax                               = pDdiTable->pfnOcSetTjMax;
    pDdiTable->pfnOcSetTjMax                             = validation_layer::zesFrequencyOcSetTjMax;

    return result;
}